

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_property.c
# Opt level: O3

int mpt_text_set(mpt_text *tx,char *name,mpt_convertable *src)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  mpt_text *in_RAX;
  mpt_color *pmVar4;
  mpt_text *from;
  mpt_text *local_28;
  
  local_28 = in_RAX;
  if (name != (char *)0x0) {
    if (*name == '\0') {
      if (src == (mpt_convertable *)0x0) {
        free(tx->_value);
        free(tx->_font);
        tx->angle = 0.0;
        (tx->color).alpha = 0xff;
        (tx->color).red = '\0';
        (tx->color).green = '\0';
        (tx->color).blue = '\0';
        tx->size = '\n';
        tx->weight = 'n';
        tx->style = 'n';
        tx->align = '5';
        (tx->pos).x = 0.5;
        (tx->pos).y = 0.5;
        tx->_value = (char *)0x0;
        tx->_font = (char *)0x0;
        return 0;
      }
      if (mpt_text_pointer_typeid::ptype == 0) {
        iVar1 = mpt_type_add(&mpt_text_pointer_typeid::traits);
        if (iVar1 < 1) {
          return -3;
        }
      }
      else {
        iVar1 = mpt_text_pointer_typeid::ptype;
        if (mpt_text_pointer_typeid::ptype < 1) {
          return -3;
        }
      }
      mpt_text_pointer_typeid::ptype = iVar1;
      iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)mpt_text_pointer_typeid::ptype,&local_28);
      if (-1 < iVar1) {
        free(tx->_value);
        free(tx->_font);
        tx->angle = 0.0;
        (tx->color).alpha = 0xff;
        (tx->color).red = '\0';
        (tx->color).green = '\0';
        (tx->color).blue = '\0';
        tx->size = '\n';
        tx->weight = 'n';
        tx->style = 'n';
        tx->align = '5';
        (tx->pos).x = 0.5;
        (tx->pos).y = 0.5;
        tx->_value = (char *)0x0;
        tx->_font = (char *)0x0;
        mpt_text_init(tx,local_28);
        return 0;
      }
      return -3;
    }
    iVar1 = strcasecmp(name,"value");
    if (iVar1 != 0) {
      iVar1 = strcasecmp(name,"font");
      if (iVar1 != 0) {
        iVar1 = strcasecmp(name,"x");
        if (iVar1 == 0) {
          if ((src != (mpt_convertable *)0x0) &&
             (uVar2 = (*src->_vptr->convert)(src,0x66,&tx->pos), uVar2 != 0)) goto LAB_00107889;
          (tx->pos).x = 0.5;
        }
        else {
          iVar1 = strcasecmp(name,"y");
          if (iVar1 == 0) {
            if ((src != (mpt_convertable *)0x0) &&
               (uVar2 = (*src->_vptr->convert)(src,0x66,&(tx->pos).y), uVar2 != 0))
            goto LAB_00107889;
            (tx->pos).y = 0.5;
          }
          else {
            iVar1 = strcasecmp(name,"pos");
            if (iVar1 == 0) {
              if ((src != (mpt_convertable *)0x0) &&
                 (uVar2 = mpt_fpoint_set(&tx->pos,src,&mpt_text_set::r), uVar2 != 0))
              goto LAB_00107889;
              (tx->pos).x = 0.5;
              (tx->pos).y = 0.5;
            }
            else {
              iVar1 = strcasecmp(name,"color");
              if (iVar1 == 0) {
                iVar1 = mpt_color_pset(&tx->color,src);
                return iVar1;
              }
              iVar1 = strcasecmp(name,"size");
              if (iVar1 == 0) {
                if ((src != (mpt_convertable *)0x0) &&
                   (uVar2 = (*src->_vptr->convert)(src,0x79,&tx->size), uVar2 != 0))
                goto LAB_00107889;
                tx->size = '\n';
              }
              else {
                iVar1 = strcasecmp(name,"align");
                if (iVar1 == 0) {
                  if ((src != (mpt_convertable *)0x0) &&
                     (uVar2 = (*src->_vptr->convert)(src,99,&tx->align), uVar2 != 0)) {
LAB_00107889:
                    return (int)uVar2 >> 0x1f & uVar2;
                  }
                  tx->align = '5';
                }
                else {
                  iVar1 = strcasecmp(name,"angle");
                  if (iVar1 != 0) {
                    return -1;
                  }
                  if ((src != (mpt_convertable *)0x0) &&
                     (uVar2 = (*src->_vptr->convert)(src,100,&tx->angle), uVar2 != 0))
                  goto LAB_00107889;
                  tx->angle = 0.0;
                }
              }
            }
          }
        }
        return 0;
      }
      tx = (mpt_text *)&tx->_font;
    }
    if (src == (mpt_convertable *)0x0) {
      mpt_string_set(&tx->_value,(char *)0x0,0);
      return 0;
    }
    iVar1 = mpt_string_pset(&tx->_value,src);
    return iVar1;
  }
  if (src == (mpt_convertable *)0x0) {
    return -4;
  }
  if (mpt_text_pointer_typeid::ptype == 0) {
    iVar1 = mpt_type_add(&mpt_text_pointer_typeid::traits);
    if (iVar1 < 1) goto LAB_001076a5;
  }
  else {
    iVar1 = mpt_text_pointer_typeid::ptype;
    if (mpt_text_pointer_typeid::ptype < 1) goto LAB_001076a5;
  }
  mpt_text_pointer_typeid::ptype = iVar1;
  iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)mpt_text_pointer_typeid::ptype,&local_28);
  if (-1 < iVar1) {
    free(tx->_value);
    free(tx->_font);
    tx->angle = 0.0;
    (tx->color).alpha = 0xff;
    (tx->color).red = '\0';
    (tx->color).green = '\0';
    (tx->color).blue = '\0';
    tx->size = '\n';
    tx->weight = 'n';
    tx->style = 'n';
    tx->align = '5';
    (tx->pos).x = 0.5;
    (tx->pos).y = 0.5;
    tx->_value = (char *)0x0;
    tx->_font = (char *)0x0;
    if (iVar1 == 0) {
      local_28 = (mpt_text *)0x0;
    }
    mpt_text_init(tx,local_28);
    return 0;
  }
LAB_001076a5:
  iVar1 = mpt_string_pset(&tx->_value,src);
  if (iVar1 < 0) {
    iVar3 = mpt_color_typeid();
    iVar1 = -3;
    if (0 < iVar3) {
      pmVar4 = &tx->color;
      iVar3 = (*src->_vptr->convert)(src,(mpt_type_t)iVar3,pmVar4);
      if ((-1 < iVar3) && (iVar1 = 0, iVar3 == 0)) {
        pmVar4->alpha = 0xff;
        pmVar4->red = '\0';
        pmVar4->green = '\0';
        pmVar4->blue = '\0';
      }
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_text_set(MPT_STRUCT(text) *tx, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	/* auto-select matching property */
	if (!name) {
		const MPT_STRUCT(text) *from;
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_text_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_text_fini(tx);
			mpt_text_init(tx, len ? from : 0);
			return 0;
		}
		if ((len = mpt_string_pset(&tx->_value, src)) >= 0) {
			return len;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &tx->color)) >= 0) {
			if (!len) tx->color = def_text.color;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		const MPT_STRUCT(text) *from;
		int type;
		
		if (!src) {
			mpt_text_fini(tx);
			return 0;
		}
		if ((type = mpt_text_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_text_fini(tx);
			mpt_text_init(tx, from);
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* set properties */
	if (!strcasecmp(name, "value")) {
		if (!src) {
			mpt_string_set(&tx->_value, 0, 0);
			return 0;
		}
		return mpt_string_pset(&tx->_value, src);
	}
	if (!strcasecmp(name, "font")) {
		if (!src) {
			mpt_string_set(&tx->_font, 0, 0);
			return 0;
		}
		return mpt_string_pset(&tx->_font, src);
	}
	if (!strcasecmp(name, "x")) {
		if (!src || !(len = src->_vptr->convert(src, 'f', &tx->pos.x))) {
			tx->pos.x = def_text.pos.x;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "y")) {
		if (!src || !(len = src->_vptr->convert(src, 'f', &tx->pos.y))) {
			tx->pos.y = def_text.pos.y;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "pos")) {
		static const MPT_STRUCT(range) r = { 0.0, 1.0 };
		if (!src || !(len = mpt_fpoint_set(&tx->pos, src, &r))) {
			tx->pos = def_text.pos;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "color")) {
		return mpt_color_pset(&tx->color, src);
	}
	if (!strcasecmp(name, "size")) {
		if (!src || !(len = src->_vptr->convert(src, 'y', &tx->size))) {
			tx->size = def_text.size;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "align")) {
		if (!src || !(len = src->_vptr->convert(src, 'c', &tx->align))) {
			tx->align = def_text.align;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "angle")) {
		if (!src || !(len = src->_vptr->convert(src, 'd', &tx->angle))) {
			tx->angle = def_text.angle;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	return MPT_ERROR(BadArgument);
}